

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O0

Name __thiscall
wasm::Outlining::addOutlinedFunction
          (Outlining *this,Module *module,RepeatedSubstring *substring,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *exprs)

{
  IString IVar1;
  RepeatedSubstring *pRVar2;
  const_reference pvVar3;
  const_reference ppEVar4;
  Name NVar5;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_118;
  uintptr_t local_100;
  uintptr_t local_f8;
  Signature local_f0;
  HeapType local_e0;
  Outlining *local_d8;
  HeapType HStack_d0;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_c8;
  StackSignature local_c0;
  value_type local_a4;
  undefined1 auStack_a0 [4];
  uint32_t exprIdx;
  StackSignature sig;
  allocator<char> local_71;
  string local_70;
  string_view local_50;
  value_type local_3c;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *pvStack_38;
  value_type startIdx;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *exprs_local;
  RepeatedSubstring *substring_local;
  Module *module_local;
  Outlining *this_local;
  Name func;
  
  pvStack_38 = exprs;
  exprs_local = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)substring;
  substring_local = (RepeatedSubstring *)module;
  module_local = (Module *)this;
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&substring->StartIndices,0);
  pRVar2 = substring_local;
  local_3c = *pvVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"outline$",&local_71);
  wasm::Name::Name((Name *)&local_50,&local_70);
  NVar5 = Names::getValidFunctionName((Module *)pRVar2,(Name)local_50);
  func.super_IString.str._M_len = NVar5.super_IString.str._M_str;
  this_local = NVar5.super_IString.str._M_len;
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  StackSignature::StackSignature((StackSignature *)auStack_a0);
  for (local_a4 = local_3c; pRVar2 = substring_local,
      local_a4 <
      local_3c +
      *(int *)&(exprs_local->
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
               super__Vector_impl_data._M_start; local_a4 = local_a4 + 1) {
    ppEVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                        (pvStack_38,(ulong)local_a4);
    StackSignature::StackSignature(&local_c0,*ppEVar4);
    StackSignature::operator+=((StackSignature *)auStack_a0,&local_c0);
  }
  local_d8 = this_local;
  HStack_d0.id = func.super_IString.str._M_len;
  local_f8 = _auStack_a0;
  local_100 = sig.params.id;
  Signature::Signature(&local_f0,_auStack_a0,sig.params);
  HeapType::HeapType(&local_e0,local_f0);
  local_118.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_118);
  NVar5.super_IString.str._M_str = (char *)local_d8;
  NVar5.super_IString.str._M_len = (size_t)&local_c8;
  Builder::makeFunction
            (NVar5,HStack_d0,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_e0.id,
             (Expression *)&local_118);
  Module::addFunction((Module *)pRVar2,&local_c8);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_c8);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_118);
  IVar1.str._M_str = (char *)func.super_IString.str._M_len;
  IVar1.str._M_len = (size_t)this_local;
  return (IString)(IString)IVar1.str;
}

Assistant:

Name addOutlinedFunction(Module* module,
                           const SuffixTree::RepeatedSubstring& substring,
                           const std::vector<Expression*>& exprs) {
    auto startIdx = substring.StartIndices[0];
    // The outlined functions can be named anything.
    Name func = Names::getValidFunctionName(*module, std::string("outline$"));
    // Calculate the function signature for the outlined sequence.
    StackSignature sig;
    for (uint32_t exprIdx = startIdx; exprIdx < startIdx + substring.Length;
         exprIdx++) {
      sig += StackSignature(exprs[exprIdx]);
    }
    module->addFunction(
      Builder::makeFunction(func, Signature(sig.params, sig.results), {}));
    return func;
  }